

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O3

void __thiscall PClassPlayerPawn::PClassPlayerPawn(PClassPlayerPawn *this)

{
  undefined1 auVar1 [16];
  
  PClassActor::PClassActor(&this->super_PClassActor);
  *(undefined ***)
   &(this->super_PClassActor).super_PClass.super_PNativeStruct.super_PStruct.super_PNamedType.
    super_PCompoundType.super_PType = &PTR_StaticType_006fdb78;
  (this->DisplayName).Chars = FString::NullString.Nothing;
  (this->SoundClass).Chars = FString::NullString.Nothing;
  (this->Face).Chars = FString::NullString.Nothing;
  (this->Portrait).Chars = FString::NullString.Nothing;
  auVar1._8_4_ = 0x723dac;
  auVar1._0_8_ = 0x723dac;
  auVar1._12_4_ = 0;
  *(undefined1 (*) [16])this->Slot = auVar1;
  *(undefined1 (*) [16])(this->Slot + 2) = auVar1;
  *(undefined1 (*) [16])(this->Slot + 4) = auVar1;
  *(undefined1 (*) [16])(this->Slot + 6) = auVar1;
  *(undefined1 (*) [16])(this->Slot + 8) = auVar1;
  FString::NullString.RefCount = FString::NullString.RefCount + 0xe;
  this->InvulMode = 0;
  this->HealingRadiusType = 0;
  (this->ColorSets).NumUsed = 0;
  TMap<int,_FPlayerColorSet,_THashTraits<int>,_TValueTraits<FPlayerColorSet>_>::SetNodeVector
            (&this->ColorSets,1);
  (this->PainFlashes).NumUsed = 0;
  TMap<FName,_PalEntry,_THashTraits<FName>,_TValueTraits<PalEntry>_>::SetNodeVector
            (&this->PainFlashes,1);
  *(undefined1 (*) [16])((long)this->HexenArmor + 0x1a) = (undefined1  [16])0x0;
  this->HexenArmor[2] = 0.0;
  this->HexenArmor[3] = 0.0;
  this->HexenArmor[0] = 0.0;
  this->HexenArmor[1] = 0.0;
  return;
}

Assistant:

PClassPlayerPawn::PClassPlayerPawn()
{
	for (size_t i = 0; i < countof(HexenArmor); ++i)
	{
		HexenArmor[i] = 0;
	}
	ColorRangeStart = 0;
	ColorRangeEnd = 0;
}